

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

Var Js::JavascriptRegExp::EntryCompile(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  charcount_t csz;
  int iVar5;
  ScriptContext *pSVar6;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar7;
  JavascriptRegExp *this_00;
  JavascriptLibrary *pJVar8;
  Var pvVar9;
  JavascriptRegExp *this_01;
  RecyclableObject *pRVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  JavascriptString *local_d0;
  JavascriptString *strOptions;
  char16 *szOptions;
  int cOpts;
  char16 *szRegex;
  JavascriptString *pJStack_a8;
  int cBody;
  JavascriptString *strBody;
  JavascriptRegExp *source;
  RegexPattern *splitPattern;
  RegexPattern *pattern;
  JavascriptRegExp *thisRegularExpression;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  TypeId local_34;
  TypeId local_28;
  TypeId typeId;
  TypeId typeId_1;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar6 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar6);
  pSVar6 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar6,(PVOID)0x0);
  iVar3 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar3);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x222,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar6 = RecyclableObject::GetScriptContext(function);
  this_00 = GetJavascriptRegExp((Arguments *)&scriptContext,L"RegExp.prototype.compile",pSVar6);
  source = (JavascriptRegExp *)0x0;
  if (((uint)function_local & 0xffffff) == 1) {
    pJVar8 = ScriptContext::GetLibrary(pSVar6);
    splitPattern = JavascriptLibrary::GetEmptyRegexPattern(pJVar8);
  }
  else {
    pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,1);
    bVar2 = VarIs<Js::JavascriptRegExp>(pvVar9);
    if (bVar2) {
      pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,1);
      this_01 = VarTo<Js::JavascriptRegExp>(pvVar9);
      splitPattern = GetPattern(this_01);
      source = (JavascriptRegExp *)GetSplitPattern(this_01);
      if (2 < ((uint)function_local & 0xffffff)) {
        pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,2);
        if (pvVar9 == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        bVar2 = TaggedInt::Is(pvVar9);
        if (bVar2) {
          local_28 = TypeIds_FirstNumberType;
        }
        else {
          bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar9);
          if (bVar2) {
            local_28 = TypeIds_Number;
          }
          else {
            pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar9);
            if (pRVar10 == (RecyclableObject *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            local_28 = RecyclableObject::GetTypeId(pRVar10);
            if ((0x57 < (int)local_28) &&
               (BVar4 = RecyclableObject::IsExternal(pRVar10), BVar4 == 0)) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                          "GetTypeId aValue has invalid TypeId");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
          }
        }
        if (local_28 != TypeIds_Undefined) {
          JavascriptError::ThrowSyntaxError(pSVar6,-0x7ff5ec67,(PCWSTR)0x0);
        }
      }
    }
    else {
      pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,1);
      bVar2 = VarIs<Js::JavascriptString>(pvVar9);
      if (bVar2) {
        pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,1);
        pJStack_a8 = VarTo<Js::JavascriptString>(pvVar9);
      }
      else {
        callInfo_local = (CallInfo)Arguments::operator[]((Arguments *)&scriptContext,1);
        if (callInfo_local == (CallInfo)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        bVar2 = TaggedInt::Is((Var)callInfo_local);
        if (bVar2) {
          local_34 = TypeIds_FirstNumberType;
        }
        else {
          bVar2 = JavascriptNumber::Is_NoTaggedIntCheck((Var)callInfo_local);
          if (bVar2) {
            local_34 = TypeIds_Number;
          }
          else {
            pRVar10 = UnsafeVarTo<Js::RecyclableObject>((Var)callInfo_local);
            if (pRVar10 == (RecyclableObject *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            local_34 = RecyclableObject::GetTypeId(pRVar10);
            if ((0x57 < (int)local_34) &&
               (BVar4 = RecyclableObject::IsExternal(pRVar10), BVar4 == 0)) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                          "GetTypeId aValue has invalid TypeId");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
          }
        }
        if (local_34 == TypeIds_Undefined) {
          pJVar8 = ScriptContext::GetLibrary(pSVar6);
          pJStack_a8 = JavascriptLibrary::GetEmptyString(pJVar8);
        }
        else {
          pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,1);
          pJStack_a8 = JavascriptConversion::ToString(pvVar9,pSVar6);
        }
      }
      csz = JavascriptString::GetLength(pJStack_a8);
      iVar3 = (*(pJStack_a8->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
      szOptions._4_4_ = 0;
      strOptions = (JavascriptString *)0x0;
      if (2 < ((uint)function_local & 0xffffff)) {
        pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,2);
        BVar4 = Js::JavascriptOperators::IsUndefinedObject(pvVar9);
        if (BVar4 == 0) {
          pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,2);
          bVar2 = VarIs<Js::JavascriptString>(pvVar9);
          if (bVar2) {
            pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,2);
            local_d0 = VarTo<Js::JavascriptString>(pvVar9);
          }
          else {
            pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,2);
            local_d0 = JavascriptConversion::ToString(pvVar9,pSVar6);
          }
          iVar5 = (*(local_d0->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
          strOptions = (JavascriptString *)CONCAT44(extraout_var_00,iVar5);
          szOptions._4_4_ = JavascriptString::GetLength(local_d0);
        }
      }
      splitPattern = RegexHelper::CompileDynamic
                               (pSVar6,(char16 *)CONCAT44(extraout_var,iVar3),csz,
                                (char16 *)strOptions,szOptions._4_4_,false);
    }
  }
  SetPattern(this_00,splitPattern);
  SetSplitPattern(this_00,(RegexPattern *)source);
  SetLastIndex(this_00,0);
  return this_00;
}

Assistant:

Var JavascriptRegExp::EntryCompile(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        JavascriptRegExp* thisRegularExpression = GetJavascriptRegExp(args, _u("RegExp.prototype.compile"), scriptContext);

        UnifiedRegex::RegexPattern* pattern;
        UnifiedRegex::RegexPattern* splitPattern = nullptr;

        if (callInfo.Count == 1 )
        {
            pattern = scriptContext->GetLibrary()->GetEmptyRegexPattern();
        }
        else if (VarIs<JavascriptRegExp>(args[1]))
        {
            JavascriptRegExp* source = VarTo<JavascriptRegExp>(args[1]);
            //compile with a regular expression
            pattern = source->GetPattern();
            splitPattern = source->GetSplitPattern();
            // second arg must be undefined if a reg expression is passed
            if(callInfo.Count > 2 &&  JavascriptOperators::GetTypeId(args[2]) != TypeIds_Undefined)
            {
                JavascriptError::ThrowSyntaxError(scriptContext, JSERR_RegExpSyntax);
            }
        }
        else
        {
            //compile with a string
            JavascriptString * strBody;
            if (VarIs<JavascriptString>(args[1]))
            {
                strBody = VarTo<JavascriptString>(args[1]);
            }
            else if(JavascriptOperators::GetTypeId(args[1]) == TypeIds_Undefined)
            {
                strBody = scriptContext->GetLibrary()->GetEmptyString();
            }
            else
            {
                strBody = JavascriptConversion::ToString(args[1], scriptContext);
            }

            int cBody = strBody->GetLength();
            const char16 *szRegex = strBody->GetSz(); // must be null terminated!
            int cOpts = 0;
            const char16 *szOptions = nullptr;

            JavascriptString * strOptions = nullptr;
            if (callInfo.Count > 2 && !JavascriptOperators::IsUndefinedObject(args[2]))
            {
                if (VarIs<JavascriptString>(args[2]))
                {
                    strOptions = VarTo<JavascriptString>(args[2]);
                }
                else
                {
                    strOptions = JavascriptConversion::ToString(args[2], scriptContext);
                }

                szOptions = strOptions->GetSz(); // must be null terminated!
                cOpts = strOptions->GetLength();
            }

            pattern = RegexHelper::CompileDynamic(scriptContext, szRegex, cBody, szOptions, cOpts, false);
        }

        thisRegularExpression->SetPattern(pattern);
        thisRegularExpression->SetSplitPattern(splitPattern);
        thisRegularExpression->SetLastIndex(0);
        return thisRegularExpression;
    }